

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

void __thiscall bssl::Vector<bssl::ALPSConfig>::~Vector(Vector<bssl::ALPSConfig> *this)

{
  std::_Destroy_n_aux<false>::__destroy_n<bssl::ALPSConfig*,unsigned_long>(this->data_,this->size_);
  OPENSSL_free(this->data_);
  this->data_ = (ALPSConfig *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

~Vector() { clear(); }